

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O2

void __thiscall QTcpServerPrivate::readNotification(QTcpServerPrivate *this)

{
  QTcpServer *this_00;
  long *plVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  SocketError SVar8;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTcpServer **)&this->field_0x8;
  do {
    iVar7 = (**(code **)(*(long *)this + 0x28))(this);
    if (this->maxConnections <= iVar7) {
      cVar6 = (**(code **)(*(long *)this->socketEngine + 0x138))();
      if (cVar6 != '\0') {
        (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,0);
      }
      break;
    }
    lVar9 = (**(code **)(*(long *)this->socketEngine + 0xa0))();
    if (lVar9 == -1) {
      SVar8 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
      if (SVar8 != TemporaryError) {
        plVar1 = *(long **)(*(long *)&this_00->field_0x8 + 0xb0);
        (**(code **)(*plVar1 + 0x140))(plVar1,0);
        SVar8 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
        this->serverSocketError = SVar8;
        QAbstractSocketEngine::errorString
                  ((QString *)&local_48,(QAbstractSocketEngine *)this->socketEngine);
        pDVar3 = (this->serverSocketErrorString).d.d;
        pcVar4 = (this->serverSocketErrorString).d.ptr;
        (this->serverSocketErrorString).d.d = local_48.d;
        (this->serverSocketErrorString).d.ptr = local_48.ptr;
        qVar2 = (this->serverSocketErrorString).d.size;
        (this->serverSocketErrorString).d.size = local_48.size;
        local_48.d = pDVar3;
        local_48.ptr = pcVar4;
        local_48.size = qVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QTcpServer::acceptError(this_00,this->serverSocketError);
      }
      break;
    }
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QTcpServer>::QPointer<void>((QPointer<QTcpServer> *)&local_48,this_00);
    (**(code **)(*(long *)this_00 + 0x70))(this_00);
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
    if (bVar5) {
      QTcpServer::newConnection(this_00);
    }
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
    if (!bVar5) {
      QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_48);
      break;
    }
    bVar5 = QTcpServer::isListening(this_00);
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_48);
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTcpServerPrivate::readNotification()
{
    Q_Q(QTcpServer);
    for (;;) {
        if (totalPendingConnections() >= maxConnections) {
#if defined (QTCPSERVER_DEBUG)
            qDebug("QTcpServerPrivate::_q_processIncomingConnection() too many connections");
#endif
            if (socketEngine->isReadNotificationEnabled())
                socketEngine->setReadNotificationEnabled(false);
            return;
        }

        qintptr descriptor = socketEngine->accept();
        if (descriptor == -1) {
            if (socketEngine->error() != QAbstractSocket::TemporaryError) {
                q->pauseAccepting();
                serverSocketError = socketEngine->error();
                serverSocketErrorString = socketEngine->errorString();
                emit q->acceptError(serverSocketError);
            }
            break;
        }
#if defined (QTCPSERVER_DEBUG)
        qDebug("QTcpServerPrivate::_q_processIncomingConnection() accepted socket %i", descriptor);
#endif
        QPointer<QTcpServer> that = q;
        q->incomingConnection(descriptor);

        if (that)
            emit q->newConnection();

        if (!that || !q->isListening())
            return;
    }
}